

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

void helicsFederateGlobalError(HelicsFederate fed,int errorCode,char *errorString,HelicsError *err)

{
  string_view message;
  Federate *pFVar1;
  long in_RDX;
  undefined4 in_ESI;
  Federate *fedObj;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  HelicsError *in_stack_ffffffffffffff88;
  int errorcode;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined1 in_stack_ffffffffffffff98 [14];
  byte bVar2;
  allocator<char> in_stack_ffffffffffffffa7;
  allocator<char> *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  pFVar1 = getFed((HelicsFederate)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  in_stack_ffffffffffffff88);
  if (pFVar1 != (Federate *)0x0) {
    bVar2 = 0;
    if (in_RDX == 0) {
      std::__cxx11::string::string
                (in_stack_ffffffffffffffc0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffffb8);
      errorcode = (int)((ulong)pFVar1 >> 0x20);
    }
    else {
      in_stack_ffffffffffffff80 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &stack0xffffffffffffffa7;
      std::allocator<char>::allocator();
      errorcode = (int)((ulong)pFVar1 >> 0x20);
      bVar2 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,
                 in_stack_ffffffffffffffb0);
    }
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff80);
    message._M_str._6_1_ = bVar2;
    message._0_14_ = in_stack_ffffffffffffff98;
    message._M_str._7_1_ = in_stack_ffffffffffffffa7;
    helics::Federate::globalError
              ((Federate *)CONCAT44(in_stack_ffffffffffffff94,in_ESI),errorcode,message);
    std::__cxx11::string::~string(in_stack_ffffffffffffff80);
    if ((bVar2 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffa7);
    }
  }
  return;
}

Assistant:

void helicsFederateGlobalError(HelicsFederate fed, int errorCode, const char* errorString, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    try {
        fedObj->globalError(errorCode, AS_STRING(errorString));
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}